

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_CleanseCss::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  int iVar7;
  char *pcVar8;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateDictionaryPeer local_170;
  TemplateDictionaryPeer peer;
  size_t sStack_160;
  undefined8 local_158;
  TemplateId TStack_150;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestCleanseCss");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy css");
  ctemplate::TemplateString::TemplateString(&local_e8,"top");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar4.length_ = local_e8.length_;
  TVar4.ptr_ = local_e8.ptr_;
  TVar4.is_immutable_ = local_e8.is_immutable_;
  TVar4._17_7_ = local_e8._17_7_;
  TVar4.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar4,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"harder css");
  ctemplate::TemplateString::TemplateString(&local_128,"foo & bar");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar5.length_ = local_128.length_;
  TVar5.ptr_ = local_128.ptr_;
  TVar5.is_immutable_ = local_128.is_immutable_;
  TVar5._17_7_ = local_128._17_7_;
  TVar5.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar5,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"hardest css");
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,";width:expression(document.cookie)");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar6.length_ = sStack_160;
  TVar6.ptr_ = (char *)peer.dict_;
  TVar6._16_8_ = local_158;
  TVar6.id_ = TStack_150;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar6,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_170,local_78);
  ctemplate::TemplateString::TemplateString(&local_190,"easy css");
  pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_170,&local_190);
  iVar7 = strcmp(pcVar8,"top");
  if (iVar7 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"easy css\"), \"top\") == 0")
    ;
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1b0,"harder css");
  pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_170,&local_1b0);
  iVar7 = strcmp(pcVar8,"foo  bar");
  if (iVar7 == 0) {
    ctemplate::TemplateString::TemplateString(&local_1d0,"hardest css");
    pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_170,&local_1d0);
    iVar7 = strcmp(pcVar8,"widthexpressiondocument.cookie");
    if (iVar7 == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"hardest css\"), \"widthexpressiondocument.cookie\") == 0"
           );
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"harder css\"), \"foo  bar\") == 0");
  exit(1);
}

Assistant:

TEST(TemplateModifiers, CleanseCss) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestCleanseCss", NULL);
  dict.SetEscapedValue("easy css", "top",
                       GOOGLE_NAMESPACE::cleanse_css);
  dict.SetEscapedValue("harder css", "foo & bar",
                       GOOGLE_NAMESPACE::cleanse_css);
  dict.SetEscapedValue("hardest css",
                       ";width:expression(document.cookie)",
                       GOOGLE_NAMESPACE::cleanse_css);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy css"),
               "top");
  EXPECT_STREQ(peer.GetSectionValue("harder css"),
               "foo  bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest css"),
               "widthexpressiondocument.cookie");
}